

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matmul.c
# Opt level: O2

void GAI_DGEMM(Integer atype,char *transa,char *transb,Integer idim,Integer jdim,Integer kdim,
              void *alpha,DoubleComplex *a,Integer adim,DoubleComplex *b,Integer bdim,
              DoubleComplex *c,Integer cdim)

{
  long cdim_t;
  long bdim_t;
  long adim_t;
  long kdim_t;
  long jdim_t;
  long idim_t;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  adim_t = adim;
  bdim_t = bdim;
  cdim_t = cdim;
  local_50 = 0;
  local_48 = 0;
  uStack_40 = 0;
  kdim_t = kdim;
  jdim_t = jdim;
  idim_t = idim;
  switch(atype) {
  case 0x3eb:
    gal_sgemm_(transa,transb,&idim_t,&jdim_t,&kdim_t,alpha,a,&adim_t,b,&bdim_t,&local_50,c,&cdim_t,1
               ,1);
    break;
  case 0x3ec:
    gal_dgemm_(transa,transb,&idim_t,&jdim_t,&kdim_t,alpha,a,&adim_t,b,&bdim_t,&local_48,c,&cdim_t,1
               ,1);
    break;
  default:
    pnga_error("ga_matmul_patch: wrong data type",atype);
    return;
  case 0x3ee:
    gal_cgemm_(transa,transb,&idim_t,&jdim_t,&kdim_t,alpha,a,&adim_t,b,&bdim_t,&local_50,c,&cdim_t,1
               ,1);
    break;
  case 0x3ef:
    gal_zgemm_(transa,transb,&idim_t,&jdim_t,&kdim_t,alpha,a,&adim_t,b,&bdim_t,&local_48,c,&cdim_t,1
               ,1);
  }
  return;
}

Assistant:

static void GAI_DGEMM(Integer atype, char *transa, char *transb, 
        Integer idim, Integer jdim, Integer kdim, void *alpha, 
        DoubleComplex *a, Integer adim, DoubleComplex *b, 
        Integer bdim, DoubleComplex *c, Integer cdim) {

    BlasInt idim_t, jdim_t, kdim_t, adim_t, bdim_t, cdim_t;
    DoubleComplex ZERO;
    SingleComplex ZERO_CF;

    idim_t=idim; jdim_t=jdim; kdim_t=kdim;
    adim_t=adim; bdim_t=bdim; cdim_t=cdim;
    ZERO.real = 0.; ZERO.imag = 0.;
    ZERO_CF.real = 0.; ZERO_CF.imag = 0.;

    switch(atype) {
        case C_FLOAT:
            BLAS_SGEMM(transa, transb, &idim_t, &jdim_t, &kdim_t,
                    (Real *)alpha, (Real *)a, &adim_t,
                    (Real *)b, &bdim_t, (Real *)&ZERO_CF,
                    (Real *)c, &cdim_t);
            break;
        case C_DBL:
            BLAS_DGEMM(transa, transb, &idim_t, &jdim_t, &kdim_t,
                    (DoublePrecision *)alpha, (DoublePrecision *)a, &adim_t,
                    (DoublePrecision *)b, &bdim_t, (DoublePrecision *)&ZERO,
                    (DoublePrecision *)c, &cdim_t);
            break;
        case C_DCPL:
            BLAS_ZGEMM(transa, transb, &idim_t, &jdim_t, &kdim_t,
                    (DoubleComplex *)alpha, (DoubleComplex *)a, &adim_t,
                    (DoubleComplex *)b, &bdim_t, (DoubleComplex *)&ZERO,
                    (DoubleComplex *)c, &cdim_t);
            break;
        case C_SCPL:
            BLAS_CGEMM(transa, transb, &idim_t, &jdim_t, &kdim_t,
                    (SingleComplex *)alpha, (SingleComplex *)a, &adim_t,
                    (SingleComplex *)b, &bdim_t, (SingleComplex *)&ZERO_CF,
                    (SingleComplex *)c, &cdim_t);
            break;
        default:
            pnga_error("ga_matmul_patch: wrong data type", atype);
    }
}